

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_data.hpp
# Opt level: O0

LogicalOperatorType __thiscall
duckdb::SerializationData::Get<duckdb::LogicalOperatorType>(SerializationData *this)

{
  reference pvVar1;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_00000028;
  SerializationData *in_stack_00000030;
  
  AssertNotEmpty<unsigned_long>(in_stack_00000030,in_stack_00000028);
  pvVar1 = ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
           top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               0xb41963);
  return (LogicalOperatorType)*pvVar1;
}

Assistant:

inline LogicalOperatorType SerializationData::Get() {
	AssertNotEmpty(enums);
	return LogicalOperatorType(enums.top());
}